

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *words,minstd_rand *rng)

{
  int32_t id;
  bool bVar1;
  entry_type eVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Dictionary *this_00;
  double dVar6;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  string token;
  undefined1 local_50 [32];
  
  local_50._0_8_ = local_50 + 0x10;
  local_50._8_8_ = 0;
  local_50[0x10] = '\0';
  reset(this,in);
  this_00 = (Dictionary *)words;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(words);
  uVar5 = 0;
  while (bVar1 = readWord(this_00,in,(string *)local_50), uVar3 = uVar5, bVar1) {
    this_00 = this;
    uVar3 = find(this,(string *)local_50);
    id = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
    if (-1 < id) {
      this_00 = this;
      eVar2 = getType(this,id);
      if (eVar2 == word) {
        dVar6 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                          (rng);
        this_00 = this;
        bVar1 = discard(this,id,(float)(dVar6 + 0.0));
        if (!bVar1) {
          this_00 = (Dictionary *)words;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(words,(string *)local_50);
        }
      }
      uVar3 = uVar5 + 1;
      if ((0x3ff < uVar5) ||
         ((uVar5 = uVar3, local_50._8_8_ == DAT_00127a88 &&
          ((local_50._8_8_ == 0 ||
           (this_00 = (Dictionary *)local_50._0_8_,
           iVar4 = bcmp((void *)local_50._0_8_,EOS_abi_cxx11_,local_50._8_8_), iVar4 == 0))))))
      break;
    }
  }
  if ((Dictionary *)local_50._0_8_ != (Dictionary *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  return uVar3;
}

Assistant:

int32_t Dictionary::getLine(std::istream& in,
                                std::vector<std::string>& words,
                                std::minstd_rand& rng) const {
      std::uniform_real_distribution<> uniform(0, 1);
      std::string token;
      int32_t ntokens = 0;

      reset(in);
      words.clear();
      while (readWord(in, token)) {
        int32_t h = find(token);
        int32_t wid = word2int_[h];
        if (wid < 0) continue;

        ntokens++;
        if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
          words.push_back(token);
        }
        if (ntokens > MAX_LINE_SIZE || token == EOS) break;
      }
      return ntokens;
    }